

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  ulong uVar1;
  uchar uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  ImFont *pIVar8;
  StbUndoRecord *pSVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  short sVar12;
  int temp;
  int iVar13;
  int iVar14;
  uint uVar15;
  ImWchar *pIVar16;
  unsigned_short *puVar17;
  int n_2;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ImStb *pIVar22;
  long lVar23;
  int n_1;
  uint uVar24;
  int iVar25;
  ImGuiInputTextState *str;
  int *piVar26;
  ulong uVar27;
  int iVar28;
  undefined8 in_R8;
  float *pfVar29;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  ImWchar *text_remaining;
  StbFindState find;
  ImWchar *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->Stb;
  uVar2 = (this->Stb).single_line;
LAB_0018b049:
  switch(key) {
  case 0x200000:
    goto switchD_0018b05c_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      (this->Stb).cursor = (this->Stb).cursor + 1;
      iVar14 = this->CurLenW;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
      iVar14 = this->CurLenW;
      iVar19 = (this->Stb).select_start;
      iVar28 = (this->Stb).select_end;
      if (iVar19 != iVar28) {
        if (iVar14 < iVar19) {
          (this->Stb).select_start = iVar14;
          iVar19 = iVar14;
        }
        if (iVar14 < iVar28) {
          (this->Stb).select_end = iVar14;
          iVar28 = iVar14;
        }
        if (iVar19 == iVar28) {
          state->cursor = iVar19;
        }
      }
    }
    if (iVar14 < state->cursor) goto LAB_0018b771;
    goto LAB_0018bdaf;
  case 0x200002:
switchD_0018b05c_caseD_200002:
    if (uVar2 == '\0') {
      uVar15 = (this->Stb).select_start;
      str = (ImGuiInputTextState *)(ulong)uVar15;
      uVar31 = (this->Stb).select_end;
      if ((key & 0x400000U) == 0) {
        if (uVar15 == uVar31) {
          str = (ImGuiInputTextState *)(ulong)(uint)state->cursor;
        }
        else {
          if ((int)uVar31 < (int)uVar15) {
            (this->Stb).select_start = uVar31;
            str = (ImGuiInputTextState *)(ulong)uVar31;
          }
          (this->Stb).cursor = (int)str;
          (this->Stb).select_end = (int)str;
          (this->Stb).has_preferred_x = '\0';
        }
LAB_0018b8e1:
        uVar30 = this->CurLenW;
      }
      else {
        if (uVar15 == uVar31) {
          uVar15 = (this->Stb).cursor;
          str = (ImGuiInputTextState *)(ulong)uVar15;
          (this->Stb).select_end = uVar15;
          (this->Stb).select_start = uVar15;
          goto LAB_0018b8e1;
        }
        (this->Stb).cursor = uVar31;
        uVar30 = this->CurLenW;
        if ((int)uVar30 < (int)uVar15) {
          (this->Stb).select_start = uVar30;
          str = (ImGuiInputTextState *)(ulong)uVar30;
        }
        uVar15 = uVar31;
        if ((int)uVar30 < (int)uVar31) {
          (this->Stb).select_end = uVar30;
          uVar15 = uVar30;
        }
        if ((uint)str == uVar15) {
          state->cursor = (uint)str;
        }
        else {
          str = (ImGuiInputTextState *)(ulong)uVar31;
        }
      }
      if ((int)uVar30 < (int)str) {
        state->cursor = uVar30;
        str = (ImGuiInputTextState *)(ulong)uVar30;
      }
      ImStb::stb_textedit_find_charpos((ImStb *)local_48,(StbFindState *)this,str,0,(int)in_R8);
      if (local_34 == local_3c) goto LAB_0018bdb3;
      pIVar22 = (ImStb *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pIVar22 = (ImStb *)local_48;
      }
      fVar35 = *(float *)pIVar22;
      (this->Stb).cursor = local_34;
      puVar17 = (this->TextW).Data;
      local_50 = (ImWchar *)0x0;
      pIVar16 = puVar17 + local_34;
      InputTextCalcTextSizeW(pIVar16,puVar17 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0))
      ;
      pIVar10 = GImGui;
      uVar15 = (uint)((ulong)((long)local_50 - (long)pIVar16) >> 1);
      if ((int)uVar15 < 1) goto LAB_0018b9ef;
      puVar17 = (this->TextW).Data;
      iVar14 = (this->Stb).cursor;
      fVar33 = 0.0;
      uVar27 = 0;
      goto LAB_0018b996;
    }
    key = key & 0x400000U | 0x200000;
    goto LAB_0018b049;
  case 0x200003:
switchD_0018b05c_caseD_200003:
    if (uVar2 != '\0') goto code_r0x0018b09a;
    uVar15 = (this->Stb).select_start;
    uVar31 = (this->Stb).select_end;
    if ((key & 0x400000U) == 0) {
      if (uVar15 == uVar31) goto LAB_0018b569;
      ImStb::stb_textedit_move_to_last(this,state);
      uVar15 = (this->Stb).select_start;
      uVar31 = (this->Stb).select_end;
LAB_0018b78c:
      uVar30 = this->CurLenW;
      if (uVar15 != uVar31) {
        if ((int)uVar30 < (int)uVar15) {
          (this->Stb).select_start = uVar30;
          uVar15 = uVar30;
        }
        if ((int)uVar30 < (int)uVar31) {
          (this->Stb).select_end = uVar30;
          uVar31 = uVar30;
        }
        if (uVar15 == uVar31) {
          state->cursor = uVar15;
        }
      }
    }
    else {
      if (uVar15 != uVar31) {
        state->cursor = uVar31;
        goto LAB_0018b78c;
      }
      iVar14 = (this->Stb).cursor;
      (this->Stb).select_end = iVar14;
      (this->Stb).select_start = iVar14;
LAB_0018b569:
      uVar30 = this->CurLenW;
    }
    uVar15 = state->cursor;
    if ((int)uVar30 < state->cursor) {
      state->cursor = uVar30;
      uVar15 = uVar30;
    }
    ImStb::stb_textedit_find_charpos
              ((ImStb *)local_48,(StbFindState *)this,(ImGuiInputTextState *)(ulong)uVar15,
               (uint)(this->Stb).single_line,(int)in_R8);
    if ((long)local_38 == 0) goto LAB_0018bdb3;
    pIVar22 = (ImStb *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pIVar22 = (ImStb *)local_48;
    }
    fVar35 = *(float *)pIVar22;
    lVar21 = (long)local_3c + (long)local_38;
    (this->Stb).cursor = (int)lVar21;
    puVar17 = (this->TextW).Data;
    local_50 = (ImWchar *)0x0;
    pIVar16 = puVar17 + lVar21;
    InputTextCalcTextSizeW(pIVar16,puVar17 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
    pIVar10 = GImGui;
    uVar15 = (uint)((ulong)((long)local_50 - (long)pIVar16) >> 1);
    if ((int)uVar15 < 1) goto LAB_0018b9ef;
    puVar17 = (this->TextW).Data;
    iVar14 = (this->Stb).cursor;
    fVar33 = 0.0;
    uVar27 = 0;
    goto LAB_0018b866;
  case 0x200004:
    uVar15 = this->CurLenW;
    uVar31 = (this->Stb).select_start;
    uVar30 = (this->Stb).select_end;
    uVar18 = uVar31;
    if (uVar31 != uVar30) {
      if ((int)uVar15 < (int)uVar31) {
        (this->Stb).select_start = uVar15;
        uVar31 = uVar15;
      }
      if ((int)uVar15 < (int)uVar30) {
        (this->Stb).select_end = uVar15;
        uVar30 = uVar15;
      }
      uVar18 = uVar30;
      if (uVar31 == uVar30) {
        state->cursor = uVar31;
        uVar18 = uVar31;
      }
    }
    uVar30 = state->cursor;
    if ((int)uVar15 < state->cursor) {
      state->cursor = uVar15;
      uVar30 = uVar15;
    }
    if (uVar31 != uVar18) {
      uVar30 = uVar31;
      if ((int)uVar18 < (int)uVar31) {
        (this->Stb).select_start = uVar18;
        uVar30 = uVar18;
      }
      (this->Stb).cursor = uVar30;
      (this->Stb).select_end = uVar30;
    }
    if (uVar2 != '\0') {
      state->cursor = 0;
      goto LAB_0018bdaf;
    }
    if ((int)uVar30 < 1) goto LAB_0018bdaf;
    puVar17 = (this->TextW).Data;
    uVar27 = (ulong)uVar30;
    goto LAB_0018bacb;
  case 0x200005:
    iVar14 = this->CurLenW;
    iVar19 = (this->Stb).select_start;
    iVar28 = (this->Stb).select_end;
    iVar25 = iVar19;
    if (iVar19 != iVar28) {
      if (iVar14 < iVar19) {
        (this->Stb).select_start = iVar14;
        iVar19 = iVar14;
      }
      if (iVar14 < iVar28) {
        (this->Stb).select_end = iVar14;
        iVar28 = iVar14;
      }
      iVar25 = iVar28;
      if (iVar19 == iVar28) {
        state->cursor = iVar19;
        iVar25 = iVar19;
      }
    }
    iVar28 = state->cursor;
    if (iVar14 < state->cursor) {
      state->cursor = iVar14;
      iVar28 = iVar14;
    }
    if (iVar19 != iVar25) {
      iVar28 = iVar19;
      if (iVar25 < iVar19) {
        (this->Stb).select_start = iVar25;
        iVar28 = iVar25;
      }
      (this->Stb).cursor = iVar28;
      (this->Stb).select_end = iVar28;
    }
    if (uVar2 != '\0') {
      state->cursor = iVar14;
      goto LAB_0018bdaf;
    }
    if (iVar14 <= iVar28) goto LAB_0018bdaf;
    puVar17 = (this->TextW).Data + iVar28;
    goto LAB_0018bb08;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_0018bdaf;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_0018bdaf;
  case 0x200008:
switchD_0018b05c_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = (this->Stb).cursor;
      if (iVar14 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_0018bdaf;
    }
    break;
  case 0x200009:
switchD_0018b05c_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = this->CurLenW;
      iVar19 = (this->Stb).cursor;
      if (iVar14 < iVar19) {
        state->cursor = iVar14;
        iVar19 = iVar14;
      }
      if (0 < iVar19) {
        ImStb::stb_textedit_delete(this,state,iVar19 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_0018bdaf;
    }
    break;
  case 0x20000a:
    lVar21 = (long)(this->Stb).undostate.undo_point;
    if (lVar21 == 0) goto LAB_0018bdaf;
    iVar14 = (this->Stb).undostate.undo_rec[lVar21 + -1].where;
    iVar19 = (this->Stb).undostate.undo_rec[lVar21 + -1].insert_length;
    uVar15 = (this->Stb).undostate.undo_rec[lVar21 + -1].delete_length;
    uVar27 = (ulong)(this->Stb).undostate.redo_point;
    iVar28 = (this->Stb).undostate.undo_rec[lVar21 + -1].char_storage;
    (this->Stb).undostate.undo_rec[uVar27 - 1].char_storage = -1;
    (this->Stb).undostate.undo_rec[uVar27 - 1].insert_length = uVar15;
    (this->Stb).undostate.undo_rec[uVar27 - 1].delete_length = iVar19;
    (this->Stb).undostate.undo_rec[uVar27 - 1].where = iVar14;
    if ((ulong)uVar15 == 0) goto LAB_0018bcea;
    iVar25 = (this->Stb).undostate.undo_char_point;
    if ((int)(iVar25 + uVar15) < 999) {
      iVar20 = (this->Stb).undostate.redo_char_point;
      if (iVar20 < (int)(iVar25 + uVar15)) goto LAB_0018bbb8;
      goto LAB_0018bc8c;
    }
    (this->Stb).undostate.undo_rec[uVar27 - 1].insert_length = 0;
    goto LAB_0018bcd8;
  case 0x20000b:
    lVar21 = (long)(this->Stb).undostate.redo_point;
    if (lVar21 != 99) {
      sVar12 = (this->Stb).undostate.undo_point;
      iVar14 = (this->Stb).undostate.undo_rec[lVar21].where;
      iVar19 = (this->Stb).undostate.undo_rec[lVar21].insert_length;
      uVar15 = (this->Stb).undostate.undo_rec[lVar21].delete_length;
      iVar28 = (this->Stb).undostate.undo_rec[lVar21].char_storage;
      (this->Stb).undostate.undo_rec[sVar12].delete_length = iVar19;
      (this->Stb).undostate.undo_rec[sVar12].insert_length = uVar15;
      (this->Stb).undostate.undo_rec[sVar12].where = iVar14;
      (this->Stb).undostate.undo_rec[sVar12].char_storage = -1;
      if ((ulong)uVar15 != 0) {
        iVar25 = (this->Stb).undostate.undo_char_point;
        if ((this->Stb).undostate.redo_char_point < (int)(iVar25 + uVar15)) {
          pSVar9 = (this->Stb).undostate.undo_rec + sVar12;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar12].char_storage = iVar25;
          (this->Stb).undostate.undo_char_point = iVar25 + uVar15;
          if (0 < (int)uVar15) {
            puVar17 = (this->TextW).Data;
            uVar27 = 0;
            do {
              (this->Stb).undostate.undo_char[(long)iVar25 + uVar27] =
                   puVar17[(long)iVar14 + uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar15 != uVar27);
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar15);
      }
      if (iVar19 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar28,iVar19)
        ;
        piVar26 = &(this->Stb).undostate.redo_char_point;
        *piVar26 = *piVar26 + iVar19;
      }
      (this->Stb).cursor = iVar19 + iVar14;
      uVar5 = (this->Stb).undostate.undo_point;
      uVar7 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar5 + 1;
      (this->Stb).undostate.redo_point = uVar7 + 1;
    }
    goto LAB_0018bdaf;
  case 0x20000c:
    iVar14 = (this->Stb).select_start;
    iVar19 = (this->Stb).select_end;
    bVar32 = SBORROW4(iVar14,iVar19);
    iVar28 = iVar14 - iVar19;
    bVar11 = iVar14 == iVar19;
    if (!bVar11) goto LAB_0018b34a;
    uVar15 = state->cursor;
    uVar31 = (int)uVar15 >> 0x1f & uVar15;
    goto LAB_0018b2fa;
  case 0x20000d:
    if ((this->Stb).select_start != (this->Stb).select_end) {
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_0018bdb3;
    }
    uVar15 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
    goto LAB_0018bb38;
  default:
    switch(key) {
    case 0x600000:
      iVar14 = this->CurLenW;
      iVar28 = (this->Stb).select_start;
      iVar19 = (this->Stb).select_end;
      if (iVar28 == iVar19) {
        iVar28 = state->cursor;
LAB_0018b702:
        iVar19 = iVar14;
        if (iVar28 < iVar14) {
          iVar19 = iVar28;
        }
        (this->Stb).select_end = iVar19;
        (this->Stb).select_start = iVar19;
      }
      else {
        if (iVar14 < iVar28) {
          (this->Stb).select_start = iVar14;
          iVar28 = iVar14;
        }
        if (iVar14 < iVar19) {
          (this->Stb).select_end = iVar14;
          iVar19 = iVar14;
        }
        if (iVar28 == iVar19) goto LAB_0018b702;
      }
      if (0 < iVar19) {
        iVar19 = iVar19 + -1;
        (this->Stb).select_end = iVar19;
      }
      (this->Stb).cursor = iVar19;
      goto LAB_0018bdaf;
    case 0x600001:
      iVar14 = (this->Stb).select_start;
      iVar19 = (this->Stb).select_end;
      if (iVar14 == iVar19) {
        iVar14 = (this->Stb).cursor;
        (this->Stb).select_start = iVar14;
        iVar19 = iVar14;
      }
      iVar28 = iVar19 + 1;
      (this->Stb).select_end = iVar28;
      if (iVar14 != iVar28) {
        iVar25 = this->CurLenW;
        if (iVar25 < iVar14) {
          (this->Stb).select_start = iVar25;
        }
        iVar14 = iVar28;
        if (iVar25 <= iVar19) {
          (this->Stb).select_end = iVar25;
          iVar14 = iVar25;
        }
      }
      (this->Stb).cursor = iVar14;
      goto LAB_0018bdaf;
    case 0x600002:
      goto switchD_0018b05c_caseD_200002;
    case 0x600003:
      goto switchD_0018b05c_caseD_200003;
    case 0x600004:
      uVar15 = this->CurLenW;
      uVar31 = (this->Stb).select_start;
      uVar30 = (this->Stb).select_end;
      uVar18 = uVar31;
      if (uVar31 != uVar30) {
        if ((int)uVar15 < (int)uVar31) {
          (this->Stb).select_start = uVar15;
          uVar31 = uVar15;
        }
        if ((int)uVar15 < (int)uVar30) {
          (this->Stb).select_end = uVar15;
          uVar30 = uVar15;
        }
        uVar18 = uVar30;
        if (uVar31 == uVar30) {
          state->cursor = uVar31;
          uVar18 = uVar31;
        }
      }
      uVar30 = state->cursor;
      if ((int)uVar15 < state->cursor) {
        state->cursor = uVar15;
        uVar30 = uVar15;
      }
      if (uVar31 == uVar18) {
        (this->Stb).select_start = uVar30;
        uVar18 = uVar30;
      }
      else {
        state->cursor = uVar18;
      }
      uVar15 = 0;
      if (uVar2 != '\0') goto LAB_0018b6c4;
      if ((int)uVar18 < 1) goto LAB_0018b6c9;
      puVar17 = (this->TextW).Data;
      uVar27 = (ulong)uVar18;
      if (puVar17[(ulong)uVar18 - 1] == 10) goto LAB_0018b6c9;
      goto LAB_0018ba7f;
    case 0x600005:
      iVar14 = this->CurLenW;
      iVar19 = (this->Stb).select_start;
      iVar28 = (this->Stb).select_end;
      iVar25 = iVar19;
      if (iVar19 != iVar28) {
        if (iVar14 < iVar19) {
          (this->Stb).select_start = iVar14;
          iVar19 = iVar14;
        }
        if (iVar14 < iVar28) {
          (this->Stb).select_end = iVar14;
          iVar28 = iVar14;
        }
        iVar25 = iVar28;
        if (iVar19 == iVar28) {
          state->cursor = iVar19;
          iVar25 = iVar19;
        }
      }
      iVar28 = state->cursor;
      if (iVar14 < state->cursor) {
        state->cursor = iVar14;
        iVar28 = iVar14;
      }
      if (iVar19 == iVar25) {
        (this->Stb).select_start = iVar28;
        iVar25 = iVar28;
      }
      else {
        state->cursor = iVar25;
      }
      iVar19 = iVar14;
      if (uVar2 != '\0') goto LAB_0018b72f;
      if (iVar14 <= iVar25) goto LAB_0018bab5;
      puVar17 = (this->TextW).Data;
      if (puVar17[iVar25] == 10) goto LAB_0018bab5;
      puVar17 = puVar17 + iVar25;
      goto LAB_0018bdde;
    case 0x600006:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar14 = 0;
      break;
    case 0x600007:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar14 = this->CurLenW;
      break;
    case 0x600008:
      goto switchD_0018b05c_caseD_200008;
    case 0x600009:
      goto switchD_0018b05c_caseD_200009;
    default:
      uVar15 = 0;
      if (key < 0x200000) {
        uVar15 = key;
      }
      if (((int)uVar15 < 1) || (local_48[0] = (ImWchar)uVar15, uVar15 == 10 && uVar2 != '\0'))
      goto LAB_0018bdb3;
      if (((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end))
      {
LAB_0018bb52:
        ImStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar11) goto LAB_0018bdb3;
        ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
      }
      else {
        iVar14 = (this->Stb).cursor;
        if (this->CurLenW <= iVar14) goto LAB_0018bb52;
        pIVar16 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar14,1,1);
        if (pIVar16 != (ImWchar *)0x0) {
          *pIVar16 = (this->TextW).Data[iVar14];
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar11) goto LAB_0018bdb3;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_0018bdaf;
    case 0x60000c:
      uVar15 = (this->Stb).cursor;
      uVar31 = (this->Stb).select_start;
      if (uVar31 == (this->Stb).select_end) {
        (this->Stb).select_end = uVar15;
        (this->Stb).select_start = uVar15;
        uVar31 = uVar15;
      }
      uVar30 = (int)uVar15 >> 0x1f & uVar15;
      goto LAB_0018b205;
    case 0x60000d:
      iVar14 = (this->Stb).cursor;
      iVar19 = (this->Stb).select_start;
      if (iVar19 == (this->Stb).select_end) {
        (this->Stb).select_end = iVar14;
        (this->Stb).select_start = iVar14;
        iVar19 = iVar14;
      }
      iVar28 = this->CurLenW;
      iVar25 = iVar14 + 1;
      if (iVar14 + 1 < iVar28) {
        iVar25 = iVar28;
      }
      goto LAB_0018b27c;
    }
    (this->Stb).select_end = iVar14;
    (this->Stb).cursor = iVar14;
    goto LAB_0018bdaf;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_0018bdaf;
  while (iVar13 = ImStb::is_word_boundary_from_right(this,iVar14), iVar20 = iVar14, iVar13 == 0) {
LAB_0018b27c:
    iVar14 = iVar14 + 1;
    iVar20 = iVar25;
    if (iVar28 <= iVar14) break;
  }
  if (iVar28 <= iVar20) {
    iVar20 = iVar28;
  }
  (this->Stb).cursor = iVar20;
  (this->Stb).select_end = iVar20;
  if (iVar19 != iVar20) {
    if (iVar28 < iVar19) {
      (this->Stb).select_start = iVar28;
      iVar19 = iVar28;
    }
    if (iVar19 == iVar20) {
      state->cursor = iVar20;
    }
  }
  goto LAB_0018bdb3;
  while( true ) {
    uVar15 = uVar15 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar15);
    uVar18 = uVar15;
    if (iVar14 != 0) break;
LAB_0018b205:
    uVar18 = uVar30 - 1;
    if ((int)uVar15 < 1) break;
  }
  uVar15 = 0;
  if (0 < (int)uVar18) {
    uVar15 = uVar18;
  }
  (this->Stb).cursor = uVar15;
  (this->Stb).select_end = uVar15;
  uVar30 = this->CurLenW;
  if (uVar31 != uVar15) {
    uVar18 = uVar31;
    if ((int)uVar30 < (int)uVar31) {
      (this->Stb).select_start = uVar30;
      uVar18 = uVar30;
    }
    uVar24 = uVar15;
    if ((int)uVar30 < (int)uVar15) {
      (this->Stb).select_end = uVar30;
      uVar24 = uVar30;
    }
    uVar31 = uVar15;
    if (uVar18 == uVar24) {
      state->cursor = uVar18;
      uVar31 = uVar18;
    }
  }
  if ((int)uVar30 < (int)uVar31) {
    state->cursor = uVar30;
  }
  goto LAB_0018bdb3;
  while (iVar25 = iVar25 + 1, iVar19 = iVar25, *puVar17 != 10) {
LAB_0018bdde:
    puVar17 = puVar17 + 1;
    iVar19 = iVar14;
    if (iVar14 + -1 == iVar25) break;
  }
LAB_0018b72f:
  iVar25 = iVar19;
  state->cursor = iVar25;
LAB_0018bab5:
  (this->Stb).select_end = iVar25;
  goto LAB_0018bdaf;
  while (uVar1 = uVar27 - 1, lVar21 = uVar27 - 2, uVar27 = uVar1, puVar17[lVar21] != 10) {
LAB_0018ba7f:
    if (uVar27 < 2) goto LAB_0018b6c4;
  }
  uVar15 = (uint)uVar1;
LAB_0018b6c4:
  uVar18 = uVar15;
  state->cursor = uVar18;
LAB_0018b6c9:
  (this->Stb).select_end = uVar18;
  goto LAB_0018bdaf;
  while( true ) {
    uVar15 = uVar15 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar15);
    uVar30 = uVar15;
    if (iVar14 != 0) break;
LAB_0018b2fa:
    uVar30 = uVar31 - 1;
    if ((int)uVar15 < 1) break;
  }
  uVar15 = 0;
  if (0 < (int)uVar30) {
    uVar15 = uVar30;
  }
LAB_0018bb38:
  (this->Stb).cursor = uVar15;
  ImStb::stb_textedit_clamp((ImGuiInputTextState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_0018bdb3;
  while( true ) {
    if (sVar12 < 99) {
      if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
        iVar25 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        iVar20 = iVar20 + iVar25;
        (this->Stb).undostate.redo_char_point = iVar20;
        pIVar16 = (this->Stb).undostate.undo_char + iVar20;
        memmove(pIVar16,pIVar16 + -(long)iVar25,(long)(999 - iVar20) * 2);
        sVar12 = (this->Stb).undostate.redo_point;
        lVar21 = (long)sVar12;
        if (lVar21 < 0x62) {
          lVar23 = lVar21 + -0x62;
          piVar26 = &(this->Stb).undostate.undo_rec[lVar21].char_storage;
          do {
            if (-1 < *piVar26) {
              *piVar26 = *piVar26 + iVar25;
            }
            piVar26 = piVar26 + 4;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0);
        }
      }
      lVar21 = (long)sVar12;
      memmove((this->Stb).undostate.undo_rec + lVar21 + 1,(this->Stb).undostate.undo_rec + lVar21,
              lVar21 * -0x10 + 0x620);
      iVar25 = (this->Stb).undostate.undo_char_point;
      uVar31 = *(int *)&(this->Stb).undostate.redo_point + 1;
      uVar27 = (ulong)uVar31;
      (this->Stb).undostate.redo_point = (short)uVar31;
      iVar20 = (this->Stb).undostate.redo_char_point;
    }
    if ((int)(uVar15 + iVar25) <= iVar20) break;
LAB_0018bbb8:
    sVar12 = (short)uVar27;
    if (sVar12 == 99) goto LAB_0018bdaf;
  }
  uVar27 = (ulong)(short)uVar27;
LAB_0018bc8c:
  (this->Stb).undostate.undo_rec[uVar27 - 1].char_storage = iVar20 - uVar15;
  (this->Stb).undostate.redo_char_point = iVar20 - uVar15;
  if (0 < (int)uVar15) {
    puVar17 = (this->TextW).Data;
    uVar27 = 0;
    do {
      *(unsigned_short *)
       ((long)this + uVar27 * 2 + (long)iVar20 * 2 + (long)(int)uVar15 * -2 + 0x694) =
           puVar17[(long)iVar14 + uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar15 != uVar27);
  }
LAB_0018bcd8:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar15);
LAB_0018bcea:
  if (iVar19 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar28,iVar19);
    piVar26 = &(this->Stb).undostate.undo_char_point;
    *piVar26 = *piVar26 - iVar19;
  }
  (this->Stb).cursor = iVar19 + iVar14;
  uVar4 = (this->Stb).undostate.undo_point;
  uVar6 = (this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_point = uVar4 + -1;
  (this->Stb).undostate.redo_point = uVar6 + -1;
  goto LAB_0018bdaf;
  while( true ) {
    state->cursor = iVar28;
    puVar17 = puVar17 + 1;
    if (iVar28 == iVar14) break;
LAB_0018bb08:
    iVar28 = iVar28 + 1;
    if (*puVar17 == 10) break;
  }
  goto LAB_0018bdaf;
code_r0x0018b09a:
  key = key & 0x400000U | 0x200001;
  goto LAB_0018b049;
LAB_0018b866:
  uVar3 = puVar17[lVar21 + uVar27];
  if (uVar3 == 10) goto LAB_0018b9ef;
  pIVar8 = pIVar10->Font;
  pfVar29 = &pIVar8->FallbackAdvanceX;
  if ((int)(uint)uVar3 < (pIVar8->IndexAdvanceX).Size) {
    pfVar29 = (float *)((ulong)((uint)uVar3 * 4) + (long)(pIVar8->IndexAdvanceX).Data);
  }
  fVar34 = (pIVar10->FontSize / pIVar8->FontSize) * *pfVar29;
  if (((fVar34 == -1.0) && (!NAN(fVar34))) || (fVar33 = fVar33 + fVar34, fVar35 < fVar33))
  goto LAB_0018b9ef;
  state->cursor = iVar14 + 1 + (int)uVar27;
  uVar27 = uVar27 + 1;
  if ((uVar15 & 0x7fffffff) == uVar27) goto LAB_0018b9ef;
  goto LAB_0018b866;
LAB_0018b996:
  uVar3 = puVar17[(long)local_34 + uVar27];
  if (uVar3 == 10) goto LAB_0018b9ef;
  pIVar8 = pIVar10->Font;
  pfVar29 = &pIVar8->FallbackAdvanceX;
  if ((int)(uint)uVar3 < (pIVar8->IndexAdvanceX).Size) {
    pfVar29 = (float *)((ulong)((uint)uVar3 * 4) + (long)(pIVar8->IndexAdvanceX).Data);
  }
  fVar34 = (pIVar10->FontSize / pIVar8->FontSize) * *pfVar29;
  if (((fVar34 == -1.0) && (!NAN(fVar34))) || (fVar33 = fVar33 + fVar34, fVar35 < fVar33))
  goto LAB_0018b9ef;
  state->cursor = iVar14 + 1 + (int)uVar27;
  uVar27 = uVar27 + 1;
  if ((uVar15 & 0x7fffffff) == uVar27) goto LAB_0018b9ef;
  goto LAB_0018b996;
LAB_0018b9ef:
  iVar14 = this->CurLenW;
  iVar19 = (this->Stb).select_start;
  iVar28 = (this->Stb).select_end;
  if (iVar19 != iVar28) {
    if (iVar14 < iVar19) {
      (this->Stb).select_start = iVar14;
      iVar19 = iVar14;
    }
    if (iVar14 < iVar28) {
      (this->Stb).select_end = iVar14;
      iVar28 = iVar14;
    }
    if (iVar19 == iVar28) {
      state->cursor = iVar19;
    }
  }
  iVar19 = state->cursor;
  if (iVar14 < state->cursor) {
    state->cursor = iVar14;
    iVar19 = iVar14;
  }
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar35;
  if ((key & 0x400000U) != 0) {
    (this->Stb).select_end = iVar19;
  }
  goto LAB_0018bdb3;
switchD_0018b05c_caseD_200000:
  iVar14 = (this->Stb).select_start;
  iVar19 = (this->Stb).select_end;
  bVar32 = SBORROW4(iVar14,iVar19);
  iVar28 = iVar14 - iVar19;
  bVar11 = iVar14 == iVar19;
  if (bVar11) {
    if (0 < state->cursor) {
      iVar14 = state->cursor + -1;
LAB_0018b771:
      state->cursor = iVar14;
    }
  }
  else {
LAB_0018b34a:
    if (!bVar11 && bVar32 == iVar28 < 0) {
      (this->Stb).select_start = iVar19;
      iVar14 = iVar19;
    }
    (this->Stb).cursor = iVar14;
    (this->Stb).select_end = iVar14;
  }
  goto LAB_0018bdaf;
  while( true ) {
    state->cursor = (int)uVar27 + -1;
    bVar11 = uVar27 < 2;
    uVar27 = uVar27 - 1;
    if (bVar11) break;
LAB_0018bacb:
    if (puVar17[uVar27 - 1] == 10) break;
  }
LAB_0018bdaf:
  (this->Stb).has_preferred_x = '\0';
LAB_0018bdb3:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}